

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O1

vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_> * __thiscall
tiger::trains::world::World::getEventsAfter
          (vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
           *__return_storage_ptr__,World *this,int startTick)

{
  pointer *pppIVar1;
  pointer ppIVar2;
  iterator __position;
  pointer pvVar3;
  ulong uVar4;
  pointer ppIVar5;
  ulong uVar6;
  IEvent *event;
  IEvent *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = (ulong)startTick;
  pvVar3 = (this->eventsHistory).
           super__Vector_base<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->eventsHistory).
                 super__Vector_base<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
          -0x5555555555555555;
  if (uVar6 <= uVar4 && uVar4 - uVar6 != 0) {
    do {
      ppIVar2 = *(pointer *)
                 ((long)&pvVar3[uVar6].
                         super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
                         ._M_impl.super__Vector_impl_data + 8);
      for (ppIVar5 = pvVar3[uVar6].
                     super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppIVar5 != ppIVar2;
          ppIVar5 = ppIVar5 + 1) {
        local_38 = *ppIVar5;
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<tiger::trains::world::IEvent*,std::allocator<tiger::trains::world::IEvent*>>::
          _M_realloc_insert<tiger::trains::world::IEvent*const&>
                    ((vector<tiger::trains::world::IEvent*,std::allocator<tiger::trains::world::IEvent*>>
                      *)__return_storage_ptr__,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          pppIVar1 = &(__return_storage_ptr__->
                      super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppIVar1 = *pppIVar1 + 1;
        }
      }
      uVar6 = uVar6 + 1;
      pvVar3 = (this->eventsHistory).
               super__Vector_base<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)(((long)(this->eventsHistory).
                                    super__Vector_base<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3)
                            * -0x5555555555555555));
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<IEvent *> World::getEventsAfter(int startTick) const
{
    std::vector<IEvent *> res;

    for (size_t i=startTick; i<eventsHistory.size(); i++)
        for (IEvent *event: eventsHistory[i])
            res.push_back(event);

    return res;
}